

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetAttachmentParametersTest::TestDefaultFramebuffer
          (GetAttachmentParametersTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  MessageBuilder local_690;
  GetNameFunc local_510;
  int local_508;
  Enum<int,_2UL> local_500;
  MessageBuilder local_4f0;
  int local_370;
  GLenum local_36c;
  GLenum error_1;
  GLint optional_parameter_dsa;
  GLint optional_parameter_legacy;
  GLuint i;
  GetNameFunc local_1e0;
  int local_1d8;
  Enum<int,_2UL> local_1d0 [2];
  MessageBuilder local_1b0;
  int local_2c;
  GLenum local_28;
  GLenum error;
  GLint parameter_dsa;
  GLint parameter_legacy;
  GLuint j;
  bool is_ok;
  Functions *gl;
  GetAttachmentParametersTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _j = CONCAT44(extraout_var,iVar1);
  parameter_legacy._3_1_ = 1;
  for (parameter_dsa = 0; (uint)parameter_dsa < 6; parameter_dsa = parameter_dsa + 1) {
    error = 0;
    local_28 = 0;
    (**(code **)(_j + 0x830))
              (0x8d40,TestDefaultFramebuffer::attachments[(uint)parameter_dsa],0x8cd0,&error);
    dVar2 = (**(code **)(_j + 0x800))();
    glu::checkError(dVar2,"glGetFramebufferParameteriv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x1085);
    (**(code **)(_j + 0x910))
              (0,TestDefaultFramebuffer::attachments[(uint)parameter_dsa],0x8cd0,&local_28);
    local_2c = (**(code **)(_j + 0x800))();
    if (local_2c == 0) {
      if (error == local_28) {
        if (local_28 != 0) {
          for (optional_parameter_dsa = 0; (uint)optional_parameter_dsa < 8;
              optional_parameter_dsa = optional_parameter_dsa + 1) {
            error_1 = 0;
            local_36c = 0;
            (**(code **)(_j + 0x830))
                      (0x8d40,TestDefaultFramebuffer::attachments[(uint)parameter_dsa],
                       TestDefaultFramebuffer::optional_pnames[(uint)optional_parameter_dsa],
                       &error_1);
            dVar2 = (**(code **)(_j + 0x800))();
            glu::checkError(dVar2,"glGetFramebufferParameteriv has failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                            ,0x10be);
            (**(code **)(_j + 0x910))
                      (0,TestDefaultFramebuffer::attachments[(uint)parameter_dsa],
                       TestDefaultFramebuffer::optional_pnames[(uint)optional_parameter_dsa],
                       &local_36c);
            local_370 = (**(code **)(_j + 0x800))();
            if (local_370 == 0) {
              if (error_1 != local_36c) {
                pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
                pTVar5 = tcu::TestContext::getLog(pTVar4);
                tcu::TestLog::operator<<
                          (&local_690,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar6 = tcu::MessageBuilder::operator<<
                                   (&local_690,
                                    (char (*) [51])
                                    "GetNamedFramebufferAttachmentParameteriv returned ");
                pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&local_36c);
                pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])0x2a796ef);
                pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&error_1);
                pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [19])" was expected for ")
                ;
                pMVar6 = tcu::MessageBuilder::operator<<
                                   (pMVar6,(char *(*) [8])
                                           TestDefaultFramebuffer::optional_pnames_strings);
                pMVar6 = tcu::MessageBuilder::operator<<
                                   (pMVar6,(char (*) [22])" parameter name  for ");
                pMVar6 = tcu::MessageBuilder::operator<<
                                   (pMVar6,TestDefaultFramebuffer::attachments_strings +
                                           (uint)parameter_dsa);
                pMVar6 = tcu::MessageBuilder::operator<<
                                   (pMVar6,(char (*) [36])" attachment of default framebuffer.");
                tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder(&local_690);
                parameter_legacy._3_1_ = 0;
              }
            }
            else {
              pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
              pTVar5 = tcu::TestContext::getLog(pTVar4);
              tcu::TestLog::operator<<
                        (&local_4f0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 (&local_4f0,
                                  (char (*) [65])
                                  "GetNamedFramebufferAttachmentParameteriv unexpectedly generated "
                                 );
              EVar7 = glu::getErrorStr(local_370);
              local_510 = EVar7.m_getName;
              local_508 = EVar7.m_value;
              local_500.m_getName = local_510;
              local_500.m_value = local_508;
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_500);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 (pMVar6,(char (*) [25])" error when called with ");
              pMVar6 = tcu::MessageBuilder::operator<<
                                 (pMVar6,TestDefaultFramebuffer::optional_pnames_strings +
                                         (uint)optional_parameter_dsa);
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [21])0x2a79c3f);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 (pMVar6,TestDefaultFramebuffer::attachments_strings +
                                         (uint)parameter_dsa);
              pMVar6 = tcu::MessageBuilder::operator<<
                                 (pMVar6,(char (*) [83])
                                         " attachment of default framebuffer. The GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE was "
                                 );
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&error);
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b6cb9a);
              tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_4f0);
              parameter_legacy._3_1_ = 0;
            }
          }
        }
      }
      else {
        pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar5 = tcu::TestContext::getLog(pTVar4);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&optional_parameter_legacy,pTVar5,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&optional_parameter_legacy,
                            (char (*) [51])"GetNamedFramebufferAttachmentParameteriv returned ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&local_28);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])0x2a796ef);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&error);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [95])
                                   " was expected for GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name of default framebuffer."
                           );
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&optional_parameter_legacy);
        parameter_legacy._3_1_ = 0;
      }
    }
    else {
      pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<(&local_1b0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_1b0,
                          (char (*) [65])
                          "GetNamedFramebufferAttachmentParameteriv unexpectedly generated ");
      EVar7 = glu::getErrorStr(local_2c);
      local_1e0 = EVar7.m_getName;
      local_1d8 = EVar7.m_value;
      local_1d0[0].m_getName = local_1e0;
      local_1d0[0].m_value = local_1d8;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_1d0);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [82])
                                 " error when called with GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name for "
                         );
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,TestDefaultFramebuffer::attachments_strings + (uint)parameter_dsa);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [36])" attachment of default framebuffer.");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b0);
      parameter_legacy._3_1_ = 0;
    }
  }
  return (bool)(parameter_legacy._3_1_ & 1);
}

Assistant:

bool GetAttachmentParametersTest::TestDefaultFramebuffer()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	static const glw::GLenum attachments[] = { GL_FRONT_LEFT, GL_FRONT_RIGHT, GL_BACK_LEFT,
											   GL_BACK_RIGHT, GL_DEPTH,		  GL_STENCIL };

	static const glw::GLchar* attachments_strings[] = { "GL_FRONT_LEFT", "GL_FRONT_RIGHT", "GL_BACK_LEFT",
														"GL_BACK_RIGHT", "GL_DEPTH",	   "GL_STENCIL" };

	static const glw::GLuint attachments_count = sizeof(attachments) / sizeof(attachments[0]);

	for (glw::GLuint j = 0; j < attachments_count; ++j)
	{
		glw::GLint parameter_legacy = 0;
		glw::GLint parameter_dsa	= 0;

		gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachments[j], GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE,
											   &parameter_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFramebufferParameteriv has failed");

		gl.getNamedFramebufferAttachmentParameteriv(0, attachments[j], GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE,
													&parameter_dsa);

		/* Error check. */
		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv unexpectedly generated "
				<< glu::getErrorStr(error)
				<< " error when called with GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name for "
				<< attachments_strings[j] << " attachment of default framebuffer." << tcu::TestLog::EndMessage;

			is_ok = false;

			continue;
		}

		if (parameter_legacy != parameter_dsa)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv returned " << parameter_dsa
				<< ", but " << parameter_legacy
				<< " was expected for GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE parameter name of default framebuffer."
				<< tcu::TestLog::EndMessage;

			is_ok = false;

			continue;
		}

		if (parameter_dsa != GL_NONE)
		{
			static const glw::GLenum optional_pnames[] = {
				GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE,		  GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE,
				GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE,	  GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE,
				GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE,	 GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE,
				GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE, GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING
			};

			static const glw::GLchar* optional_pnames_strings[] = {
				"GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE",		"GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE",
				"GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE",		"GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE",
				"GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE",		"GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE",
				"GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE", "GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING"
			};

			static const glw::GLuint optional_pnames_count = sizeof(optional_pnames) / sizeof(optional_pnames[0]);

			for (glw::GLuint i = 0; i < optional_pnames_count; ++i)
			{
				glw::GLint optional_parameter_legacy = 0;
				glw::GLint optional_parameter_dsa	= 0;

				gl.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachments[j], optional_pnames[i],
													   &optional_parameter_legacy);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFramebufferParameteriv has failed");

				gl.getNamedFramebufferAttachmentParameteriv(0, attachments[j], optional_pnames[i],
															&optional_parameter_dsa);

				if (glw::GLenum error = gl.getError())
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv unexpectedly generated "
						<< glu::getErrorStr(error) << " error when called with " << optional_pnames_strings[i]
						<< " parameter name for " << attachments_strings[j]
						<< " attachment of default framebuffer. The GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE was "
						<< parameter_legacy << "." << tcu::TestLog::EndMessage;

					is_ok = false;

					continue;
				}

				if (optional_parameter_legacy != optional_parameter_dsa)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetNamedFramebufferAttachmentParameteriv returned "
						<< optional_parameter_dsa << ", but " << optional_parameter_legacy << " was expected for "
						<< optional_pnames_strings << " parameter name  for " << attachments_strings[j]
						<< " attachment of default framebuffer." << tcu::TestLog::EndMessage;

					is_ok = false;

					continue;
				}
			}
		}
	}

	return is_ok;
}